

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

bool testing::internal::ParseGoogleMockFlag(char *str,char *flag_name,bool *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  pcVar2 = ParseGoogleMockFlagValue(str,"catch_leaked_mocks",true);
  if (pcVar2 != (char *)0x0) {
    cVar1 = *pcVar2;
    bVar3 = false;
    if ((cVar1 != '0') && (bVar3 = false, cVar1 != 'f')) {
      bVar3 = cVar1 != 'F';
    }
    *flag_name = bVar3;
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

static bool ParseGoogleMockFlag(const char* str, const char* flag_name,
                                bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag_name, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}